

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::UpdateLidar(UKF *this,MeasurementPackage *meas_package)

{
  VectorXd *this_00;
  double adVar1 [1];
  double dVar2;
  uint uVar3;
  DenseIndex size_00;
  double *pdVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  Index index;
  undefined8 *puVar8;
  DenseStorage<double,__1,__1,__1,_0> *pDVar9;
  long lVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar11;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  Index index_2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  double *pdVar16;
  long lVar17;
  double *pdVar18;
  DenseStorage<double,__1,__1,__1,_0> *pDVar19;
  ulong uVar20;
  Index size;
  bool bVar21;
  MatrixXd Zsig;
  VectorXd z;
  MatrixXd S;
  MatrixXd Tc;
  MatrixXd K;
  MatrixXd R;
  VectorXd x_diff;
  VectorXd z_diff;
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_160;
  undefined1 local_128 [24];
  DenseStorage<double,__1,__1,__1,_0> *pDStack_110;
  long local_108;
  undefined1 local_f8 [16];
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  local_d0;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  DenseStorage<double,__1,__1,__1,_0> local_90;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  undefined1 local_48 [16];
  plain_array<double,_1,_0,_0> local_38;
  
  size_00 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_f8,size_00,size_00,1);
  pDVar19 = (DenseStorage<double,__1,__1,__1,_0> *)
            (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)pDVar19 < 0) {
LAB_001065c5:
    pcVar15 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001065da;
  }
  if ((DenseStorage<double,__1,__1,__1,_0> *)local_f8._8_8_ != pDVar19) {
    free((void *)local_f8._0_8_);
    if (pDVar19 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
      local_f8._0_8_ = (double *)0x0;
    }
    else {
      if ((ulong)pDVar19 >> 0x3d != 0) {
LAB_00105979:
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = operator_delete;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_f8._0_8_ = malloc((long)pDVar19 * 8);
      if ((double *)local_f8._0_8_ == (double *)0x0) goto LAB_00105979;
    }
    local_f8._8_8_ = pDVar19;
    if (pDVar19 !=
        (DenseStorage<double,__1,__1,__1,_0> *)
        (meas_package->raw_measurements_).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pcVar15 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00106758;
    }
  }
  pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((ulong)pDVar19 & 0x7ffffffffffffffe);
  if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < pDVar19) {
    pDVar12 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    do {
      pdVar16 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                (long)pDVar12;
      dVar2 = pdVar16[1];
      *(double *)(local_f8._0_8_ + pDVar12 * 8) = *pdVar16;
      ((double *)(local_f8._0_8_ + pDVar12 * 8))[1] = dVar2;
      pDVar12 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar12->m_data + 2);
    } while (pDVar12 < pDVar9);
  }
  if ((long)pDVar9 < (long)pDVar19) {
    pdVar16 = (meas_package->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    do {
      *(double *)(local_f8._0_8_ + pDVar9 * 8) = pdVar16[(long)pDVar9];
      pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar9->m_data + 1);
    } while (pDVar19 != pDVar9);
  }
  uVar3 = this->n_aug_;
  local_128._16_8_ = (void *)0x0;
  pDStack_110 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
  local_108 = 0;
  if (-1 < (int)uVar3) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(local_128 + 0x10),(ulong)uVar3 * 4 + 2,2,
               (ulong)uVar3 * 2 + 1);
    if (-1 < this->n_aug_) {
      uVar13 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if ((long)uVar13 < 1) {
LAB_0010651b:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      uVar3 = this->n_aug_ * 2;
      uVar20 = 0;
      uVar14 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar14 = uVar20;
      }
      pdVar16 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data + 1;
      pdVar18 = (double *)(local_128._16_8_ + 8);
      do {
        if (((((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols <= (long)uVar20) || (uVar13 < 2)) || ((long)pDStack_110 < 1)) ||
           (local_108 <= (long)uVar20)) goto LAB_0010651b;
        dVar2 = *pdVar16;
        pdVar18[-1] = pdVar16[-1];
        if (pDStack_110 < (DenseStorage<double,__1,__1,__1,_0> *)0x2) goto LAB_0010651b;
        *pdVar18 = dVar2;
        uVar20 = uVar20 + 1;
        pdVar16 = pdVar16 + uVar13;
        pdVar18 = pdVar18 + (long)pDStack_110;
      } while (uVar14 + 1 != uVar20);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)local_128,2,2,1);
    if ((long)local_128._8_8_ < 0) {
      pcVar15 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_001066b8;
    }
    if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < (ulong)local_128._8_8_) {
      uVar13 = 0;
      do {
        *(double *)(local_128._0_8_ + uVar13 * 8) = 0.0;
        ((double *)(local_128._0_8_ + uVar13 * 8))[1] = 0.0;
        uVar13 = uVar13 + 2;
      } while (uVar13 < (local_128._8_8_ & 0x7ffffffffffffffe));
    }
    if ((long)(local_128._8_8_ & 0x7ffffffffffffffe) < (long)local_128._8_8_) {
      memset((void *)((local_128._8_8_ << 3 & 0xfffffffffffffff0) + local_128._0_8_),0,
             (ulong)((uint)(local_128._8_8_ << 3) & 8));
    }
    if (-1 < this->n_aug_) {
      lVar10 = 0;
      lVar17 = 0;
      do {
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar17) goto LAB_0010658f;
        if (((long)pDStack_110 < 0) &&
           ((void *)(local_128._16_8_ + (long)pDStack_110 * lVar17 * 8) != (void *)0x0))
        goto LAB_00106559;
        if (local_108 <= lVar17) goto LAB_0010653a;
        if ((DenseStorage<double,__1,__1,__1,_0> *)local_128._8_8_ != pDStack_110) {
          pcVar15 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
          goto LAB_001065f9;
        }
        if ((long)pDStack_110 < 0) goto LAB_001065c5;
        dVar2 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[lVar17];
        local_128._8_8_ = pDStack_110;
        pDVar19 = (DenseStorage<double,__1,__1,__1,_0> *)((ulong)pDStack_110 & 0x7ffffffffffffffe);
        if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < pDStack_110) {
          pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
          do {
            dVar6 = ((double *)(local_128._0_8_ + pDVar9 * 8))[1];
            pdVar16 = (double *)(local_128._16_8_ + (long)pDVar9 * 8 + (long)pDStack_110 * lVar10);
            dVar7 = pdVar16[1];
            *(double *)(local_128._0_8_ + pDVar9 * 8) =
                 *pdVar16 * dVar2 + *(double *)(local_128._0_8_ + pDVar9 * 8);
            ((double *)(local_128._0_8_ + pDVar9 * 8))[1] = dVar7 * dVar2 + dVar6;
            pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar9->m_data + 2);
          } while (pDVar9 < pDVar19);
        }
        if ((long)pDVar19 < (long)pDStack_110) {
          do {
            *(double *)(local_128._0_8_ + pDVar19 * 8) =
                 *(double *)(local_128._16_8_ + (long)pDVar19 * 8 + (long)pDStack_110 * lVar10) *
                 dVar2 + *(double *)(local_128._0_8_ + pDVar19 * 8);
            pDVar19 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar19->m_data + 1);
          } while (pDStack_110 != pDVar19);
        }
        lVar10 = lVar10 + 8;
        bVar21 = SBORROW8(lVar17,(long)this->n_aug_ * 2);
        lVar5 = lVar17 + (long)this->n_aug_ * -2;
        lVar17 = lVar17 + 1;
      } while (bVar21 != lVar5 < 0);
    }
    local_e8.m_data = (double *)0x0;
    local_e8.m_rows = 0;
    local_e8.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)(local_f8 + 0x10),4,2,2);
    local_160.m_lhs = (LhsNested)local_e8.m_rows;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_cols;
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    if (-1 < (local_e8.m_cols | local_e8.m_rows)) {
      pDVar19 = (DenseStorage<double,__1,__1,__1,_0> *)(local_f8 + 0x10);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pDVar19,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_160);
      if (-1 < this->n_aug_) {
        lVar17 = 0;
        do {
          pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)
                   (local_128._16_8_ + (long)pDStack_110 * lVar17 * 8);
          if ((long)pDStack_110 < 0 && pDVar9 != (DenseStorage<double,__1,__1,__1,_0> *)0x0)
          goto LAB_00106559;
          if (local_108 <= lVar17) goto LAB_0010653a;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)pDStack_110;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = (DenseIndex)(local_128 + 0x10);
          local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data = (double *)pDStack_110;
          local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows = (DenseIndex)local_128;
          local_160.m_lhs = (LhsNested)pDVar9;
          if (pDStack_110 != (DenseStorage<double,__1,__1,__1,_0> *)local_128._8_8_)
          goto LAB_001065ae;
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)&local_78,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_160);
          if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar17) goto LAB_0010658f;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)
                    (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[lVar17];
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = 0;
          local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data = (double *)0x0;
          local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows = 0;
          local_160.m_lhs = (LhsNested)&local_78;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows = (DenseIndex)&local_78;
          local_d0.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_lhs = (LhsNested)pDVar19;
          local_d0.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
          if (((DenseStorage<double,__1,__1,__1,_0> *)local_e8.m_rows !=
               *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_160.m_lhs + 8)) ||
             ((DenseStorage<double,__1,__1,__1,_0> *)local_e8.m_cols !=
              *(DenseStorage<double,__1,__1,__1,_0> **)
               (local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows + 8))) goto LAB_00106578;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pDVar19,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                      *)&local_d0);
          free((void *)local_160.m_rhs.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols);
          free(local_78.m_data);
          bVar21 = SBORROW8(lVar17,(long)this->n_aug_ * 2);
          lVar10 = lVar17 + (long)this->n_aug_ * -2;
          lVar17 = lVar17 + 1;
        } while (bVar21 != lVar10 < 0);
      }
      local_78.m_data = (double *)0x0;
      local_78.m_rows = 0;
      local_78.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_78,4,2,2);
      local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = 1;
      local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = 1;
      *local_78.m_data = this->std_laspx_ * this->std_laspx_;
      local_d0.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_lhs = (LhsNested)0x0;
      local_160.m_lhs = (LhsNested)&local_78;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_160
                           ,(Scalar *)&local_d0);
      local_a8.m_data = (double *)0x0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,(Scalar *)&local_a8);
      local_90.m_data = (double *)(this->std_laspy_ * this->std_laspy_);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar11,(Scalar *)&local_90);
      pDVar9 = *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_160.m_lhs + 0x10);
      if ((undefined1 *)
          ((long)local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
          (long)(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols) != *(undefined1 **)((long)local_160.m_lhs + 8)) {
        if (pDVar9 != (DenseStorage<double,__1,__1,__1,_0> *)0x0) goto LAB_00106684;
        pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      }
      if ((DenseStorage<double,__1,__1,__1,_0> *)
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows != pDVar9) {
LAB_00106684:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CommaInitializer.h"
                      ,0x6f,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      local_160.m_lhs = (LhsNested)pDVar19;
      local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)&local_78;
      if ((local_e8.m_rows != local_78.m_rows) || (local_e8.m_cols != local_78.m_cols)) {
        pcVar15 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
        ;
        goto LAB_001065f9;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_f8 + 0x10),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_160);
      local_a8.m_data = (double *)0x0;
      local_a8.m_rows = 0;
      local_a8.m_cols = 0;
      lVar17 = (long)this->n_x_;
      if (lVar17 < 0) goto LAB_00106603;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_a8,lVar17 * 2,lVar17,2);
      local_160.m_lhs = (LhsNested)local_a8.m_rows;
      local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_a8.m_cols;
      local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = 0;
      if (-1 < (local_a8.m_cols | local_a8.m_rows)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_160);
        if (-1 < this->n_aug_) {
          lVar17 = 0;
          do {
            pDVar19 = (DenseStorage<double,__1,__1,__1,_0> *)
                      (local_128._16_8_ + (long)pDStack_110 * lVar17 * 8);
            if ((long)pDStack_110 < 0 && pDVar19 != (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
LAB_00106559:
              __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/MapBase.h"
                            ,0x94,
                            "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                           );
            }
            if (local_108 <= lVar17) {
LAB_0010653a:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                            ,0x76,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data = (double *)pDStack_110;
            local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols = (DenseIndex)(local_128 + 0x10);
            local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data = (double *)pDStack_110;
            local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows = (DenseIndex)local_128;
            local_160.m_lhs = (LhsNested)pDVar19;
            if (pDStack_110 != (DenseStorage<double,__1,__1,__1,_0> *)local_128._8_8_)
            goto LAB_001065ae;
            Eigen::Matrix<double,-1,1,0,-1,1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((Matrix<double,_1,1,0,_1,1> *)&local_90,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_160);
            pDVar19 = (DenseStorage<double,__1,__1,__1,_0> *)
                      (this->Xsig_pred_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
            pDVar9 = (DenseStorage<double,__1,__1,__1,_0> *)
                     ((this->Xsig_pred_).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + (long)pDVar19 * lVar17);
            if ((long)pDVar19 < 0 && pDVar9 != (DenseStorage<double,__1,__1,__1,_0> *)0x0)
            goto LAB_00106559;
            if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols <= lVar17) goto LAB_0010653a;
            local_160.m_lhs = (LhsNested)pDVar9;
            local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols = (DenseIndex)&this->Xsig_pred_;
            local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data = (double *)pDVar19;
            local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows = (DenseIndex)&this->x_;
            if (pDVar19 !=
                (DenseStorage<double,__1,__1,__1,_0> *)
                (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) goto LAB_001065ae;
            local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data = (double *)pDVar19;
            Eigen::Matrix<double,-1,1,0,-1,1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                      ((Matrix<double,_1,1,0,_1,1> *)&local_60,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)&local_160);
            if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= lVar17) {
LAB_0010658f:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x18a,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data =
                 (double *)
                 (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar17];
            local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows = (DenseIndex)&local_90;
            local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols = 0;
            local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data = (double *)0x0;
            local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows = 0;
            local_d0.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_lhs = (LhsNested)&local_a8;
            local_160.m_lhs = (LhsNested)&local_60;
            local_d0.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
            if (((DenseStorage<double,__1,__1,__1,_0> *)local_a8.m_rows !=
                 *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_160.m_lhs + 8)) ||
               ((DenseStorage<double,__1,__1,__1,_0> *)local_a8.m_cols !=
                *(DenseStorage<double,__1,__1,__1,_0> **)
                 (local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows + 8))) goto LAB_00106578;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                        *)&local_d0);
            free((void *)local_160.m_rhs.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols);
            free(local_60.m_data);
            free(local_90.m_data);
            bVar21 = SBORROW8(lVar17,(long)this->n_aug_ * 2);
            lVar10 = lVar17 + (long)this->n_aug_ * -2;
            lVar17 = lVar17 + 1;
          } while (bVar21 != lVar10 < 0);
        }
        if (local_e8.m_rows != local_e8.m_cols) {
LAB_0010664b:
          __assert_fail("rows() == cols()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/LU/Inverse.h"
                        ,0x143,
                        "const internal::inverse_impl<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1>]"
                       );
        }
        adVar1[0] = (double)((long)local_f8 + 0x10);
        local_d0.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_lhs = (LhsNested)adVar1[0];
        Eigen::
        ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
        ::ProductBase(&local_160,(Matrix<double,__1,__1,_0,__1,__1> *)&local_a8,
                      (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)&local_d0);
        other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_90,*(long *)(other + 0x10) * *(long *)(other + 8),*(long *)(other + 8),
                   *(long *)(other + 0x10));
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_90,other);
        free(local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)local_128;
        local_160.m_lhs = (LhsNested)local_f8;
        if (local_f8._8_8_ == local_128._8_8_) {
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)local_48,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_160);
          local_60.m_data = (double *)local_48;
          if (local_e8.m_rows != local_e8.m_cols) goto LAB_0010664b;
          local_38.array[0] = (double  [1])(double  [1])adVar1[0];
          Eigen::
          ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                         *)&local_160,
                        (Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_60,
                        (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)&local_38);
          Eigen::
          GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>
          ::GeneralProduct((GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3>
                            *)&local_d0,
                           (GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>
                            *)&local_160,(Matrix<double,__1,_1,_0,__1,_1> *)local_48);
          this->NIS_laser_ =
               (double)local_d0.
                       super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_lhs;
          free(local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data);
          free(local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data);
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows = 0;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = 0;
          local_160.m_lhs = (LhsNested)&local_90;
          local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)local_48;
          if (local_90.m_cols != local_48._8_8_) {
            pcVar15 = 
            "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
            ;
LAB_00106739:
            __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/ProductBase.h"
                          ,0x66,pcVar15);
          }
          this_00 = &this->x_;
          local_d0.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_lhs = (LhsNested)this_00;
          local_d0.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_rhs = (RhsNested)
                   Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160);
          if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows == *(DenseIndex *)((long)local_160.m_lhs + 8)) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>_>
                        *)&local_d0);
            uVar13 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows;
            if (uVar13 != *(DenseIndex *)
                           ((long)local_d0.
                                  super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                  .m_rhs + 8)) {
              pcVar15 = 
              "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>]"
              ;
LAB_00106758:
              __assert_fail("rows() == other.rows() && cols() == other.cols()",
                            "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                            ,0x1f9,pcVar15);
            }
            uVar14 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar13) {
              lVar17 = 0;
              do {
                dVar6 = (*(double **)
                          &(local_d0.
                            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        + lVar17)[1];
                dVar2 = (*(double **)
                          &(local_d0.
                            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        + lVar17)[1];
                pdVar16 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data + lVar17;
                *pdVar16 = (*(double **)
                             &(local_d0.
                               super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              .m_lhs)->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                           [lVar17] +
                           (*(double **)
                             &(local_d0.
                               super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                              .m_rhs)->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                           [lVar17];
                pdVar16[1] = dVar6 + dVar2;
                lVar17 = lVar17 + 2;
              } while (lVar17 < (long)uVar14);
            }
            if ((long)uVar14 < (long)uVar13) {
              pdVar16 = *(double **)
                         &(local_d0.
                           super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
              pdVar18 = *(double **)
                         &(local_d0.
                           super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
              pdVar4 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              do {
                pdVar4[uVar14] = pdVar16[uVar14] + pdVar18[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            free((void *)local_160.m_rhs.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows);
            local_d0.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)0x0;
            local_d0.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = 0;
            local_d0.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols = 0;
            local_d0.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_lhs = (LhsNested)&local_90;
            local_d0.
            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
            .m_rhs = (RhsNested)adVar1[0];
            if (local_90.m_cols != local_e8.m_rows) {
              pcVar15 = 
              "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>]"
              ;
              goto LAB_00106739;
            }
            local_38.array[0] = (double  [1])(double  [1])&local_90;
            Eigen::
            ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&local_160,&local_d0,
                          (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_38);
            local_60.m_data = (double *)&this->P_;
            local_60.m_rows =
                 (DenseIndex)Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_160)
            ;
            if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows == *(DenseIndex *)((long)local_160.m_lhs + 8)) &&
               ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols ==
                *(DenseIndex *)
                 ((long)local_160.m_rhs.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data + 8))) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
              lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->P_,
                         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
                          *)&local_60);
              free((void *)local_160.m_rhs.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows);
              free(local_d0.
                   super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                   .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data);
              free((void *)local_48._0_8_);
              free(local_90.m_data);
              free(local_a8.m_data);
              free(local_78.m_data);
              free(local_e8.m_data);
              free((void *)local_128._0_8_);
              free((void *)local_128._16_8_);
              free((void *)local_f8._0_8_);
              return;
            }
            pcVar15 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>]"
            ;
          }
          else {
            pcVar15 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>]"
            ;
          }
        }
        else {
          pcVar15 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
        }
        goto LAB_001065f9;
      }
    }
    local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    pcVar15 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_001066b8:
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,pcVar15);
  }
LAB_00106603:
  pcVar15 = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_001065da:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,pcVar15);
LAB_001065ae:
  pcVar15 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
  local_160.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = local_160.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data;
  goto LAB_001065f9;
LAB_00106578:
  pcVar15 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
  ;
LAB_001065f9:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,pcVar15);
}

Assistant:

void UKF::UpdateLidar(MeasurementPackage meas_package) {
  /**
  TODO:
  Complete this function! Use lidar data to update the belief about the object's
  position. Modify the state vector, x_, and covariance, P_.
  You'll also need to calculate the lidar NIS.
  */

  //extract measurement as VectorXd
  VectorXd z = meas_package.raw_measurements_;

  //set measurement dimension, lidar can measure p_x and p_y
  int n_z = 2;

  //create matrix for sigma points in measurement space
  MatrixXd Zsig = MatrixXd(n_z, 2 * n_aug_ + 1);

  //transform sigma points into measurement space
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    // extract values for better readibility
    double p_x = Xsig_pred_(0, i);
    double p_y = Xsig_pred_(1, i);

    // measurement model
    Zsig(0, i) = p_x;
    Zsig(1, i) = p_y;
  }

  //mean predicted measurement
  VectorXd z_pred = VectorXd(n_z);
  z_pred.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {
    z_pred = z_pred + weights_(i) * Zsig.col(i);
  }

  //measurement covariance matrix S
  MatrixXd S = MatrixXd(n_z, n_z);
  S.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;

    S = S + weights_(i) * z_diff * z_diff.transpose();
  }

  //add measurement noise covariance matrix
  MatrixXd R = MatrixXd(n_z, n_z);
  R << std_laspx_*std_laspx_, 0,
       0, std_laspy_*std_laspy_;
  S = S + R;

  //create matrix for cross correlation Tc
  MatrixXd Tc = MatrixXd(n_x_, n_z);

  /*****************************************************************************
  *  UKF Update for Lidar
  ****************************************************************************/
  //calculate cross correlation matrix
  Tc.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;

    // state difference
    VectorXd x_diff = Xsig_pred_.col(i) - x_;

    Tc = Tc + weights_(i) * x_diff * z_diff.transpose();
  }

  //Kalman gain K;
  MatrixXd K = Tc * S.inverse();

  //residual
  VectorXd z_diff = z - z_pred;

  //calculate NIS
  NIS_laser_ = z_diff.transpose() * S.inverse() * z_diff;

  //update state mean and covariance matrix
  x_ = x_ + K * z_diff;
  P_ = P_ - K*S*K.transpose();

}